

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkQueue.c
# Opt level: O2

_Bool deque(queue *q)

{
  size_t sVar1;
  long lVar2;
  
  sVar1 = q->size;
  if (sVar1 != 0) {
    q->size = sVar1 - 1;
    lVar2 = q->head;
    q->elements[lVar2] = (chunk *)0x0;
    q->head = (lVar2 + 1U) % q->capacity;
  }
  return sVar1 != 0;
}

Assistant:

bool deque(queue* q)
{
    if (q->size <= 0) { return false; }
    else
    {
        q->size--;
        q->elements[q->head] = NULL; //remove the ptr to the element
        q->head = (++q->head) % q->capacity;
    }

    return true;
}